

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_DecVarCost(Sfm_Dec_t *p,word (*Masks) [8],int d,int (*Counts) [2])

{
  int iVar1;
  int iVar2;
  word *x;
  int Num;
  word *pPats;
  int c;
  int (*Counts_local) [2];
  int d_local;
  word (*Masks_local) [8];
  Sfm_Dec_t *p_local;
  
  pPats._4_4_ = 0;
  while( true ) {
    if (1 < pPats._4_4_) {
      return;
    }
    x = Sfm_DecDivPats(p,d,pPats._4_4_);
    iVar1 = Abc_TtCountOnesVec(Masks[pPats._4_4_],p->nPatWords[pPats._4_4_]);
    iVar2 = Abc_TtCountOnesVecMask(x,Masks[pPats._4_4_],p->nPatWords[pPats._4_4_],0);
    Counts[pPats._4_4_][1] = iVar2;
    Counts[pPats._4_4_][0] = iVar1 - Counts[pPats._4_4_][1];
    if ((Counts[pPats._4_4_][0] < 0) || (Counts[pPats._4_4_][1] < 0)) break;
    pPats._4_4_ = pPats._4_4_ + 1;
  }
  __assert_fail("Counts[c][0] >= 0 && Counts[c][1] >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                ,0x274,"void Sfm_DecVarCost(Sfm_Dec_t *, word (*)[8], int, int (*)[2])");
}

Assistant:

void Sfm_DecVarCost( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS], int d, int Counts[2][2] )
{
    int c; 
    for ( c = 0; c < 2; c++ )
    {
        word * pPats = Sfm_DecDivPats( p, d, c );
        int Num = Abc_TtCountOnesVec( Masks[c], p->nPatWords[c] );
        Counts[c][1] = Abc_TtCountOnesVecMask( pPats, Masks[c], p->nPatWords[c], 0 );
        Counts[c][0] = Num - Counts[c][1];
        assert( Counts[c][0] >= 0 && Counts[c][1] >= 0 );
    }
    //printf( "%5d %5d   %5d %5d \n", Counts[0][0], Counts[0][1], Counts[1][0], Counts[1][1] );
}